

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O0

void __thiscall Storage::Tape::UEF::queue_carrier_tone_with_dummy(UEF *this)

{
  int local_18;
  int local_14;
  uint post_cycles;
  uint pre_cycles;
  UEF *this_local;
  
  local_14 = gzget16(this->file_);
  local_18 = gzget16(this->file_);
  while (local_14 != 0) {
    queue_bit(this,1);
    local_14 = local_14 + -1;
  }
  queue_implicit_byte(this,0xaa);
  while (local_18 != 0) {
    queue_bit(this,1);
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void UEF::queue_carrier_tone_with_dummy() {
	unsigned int pre_cycles = unsigned(gzget16(file_));
	unsigned int post_cycles = unsigned(gzget16(file_));
	while(pre_cycles--) queue_bit(1);
	queue_implicit_byte(0xaa);
	while(post_cycles--) queue_bit(1);
}